

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_args.c
# Opt level: O1

REF_STATUS ref_args_char(REF_INT n,char **args,char *long_target,char *short_target,char **value)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  *value = (char *)0x0;
  iVar2 = -1;
  if (n < 1) {
    bVar1 = false;
  }
  else {
    uVar4 = 0;
    do {
      iVar2 = strcmp(long_target,args[uVar4]);
      if (iVar2 == 0) {
        bVar1 = true;
        iVar2 = (int)uVar4;
        goto LAB_0010ecd9;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
    bVar1 = false;
    iVar2 = -1;
  }
LAB_0010ecd9:
  if (bVar1) {
    if (n + -1 <= iVar2) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_args.c",0x39,
             "ref_args_char","missing value");
LAB_0010eda2:
      printf("for option %s",long_target);
      return 1;
    }
  }
  else {
    iVar2 = -1;
    if (0 < n) {
      uVar4 = 0;
      do {
        iVar3 = strcmp(short_target,args[uVar4]);
        if (iVar3 == 0) {
          bVar1 = true;
          iVar2 = (int)uVar4;
          goto LAB_0010ed4d;
        }
        uVar4 = uVar4 + 1;
      } while ((uint)n != uVar4);
    }
    bVar1 = false;
LAB_0010ed4d:
    if (!bVar1) {
      return 5;
    }
    if (n + -1 <= iVar2) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_args.c",0x3f,
             "ref_args_char","missing value");
      long_target = short_target;
      goto LAB_0010eda2;
    }
  }
  *value = args[(long)iVar2 + 1];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_args_char(REF_INT n, char **args,
                                 const char *long_target,
                                 const char *short_target, char **value) {
  REF_INT pos;
  *value = NULL;
  if (REF_SUCCESS == ref_args_find(n, args, long_target, &pos)) {
    RAB(pos < n - 1, "missing value",
        { printf("for option %s", long_target); });
    *value = args[pos + 1];
    return REF_SUCCESS;
  }
  if (REF_SUCCESS == ref_args_find(n, args, short_target, &pos)) {
    RAB(pos < n - 1, "missing value",
        { printf("for option %s", short_target); });
    *value = args[pos + 1];
    return REF_SUCCESS;
  }
  return REF_NOT_FOUND;
}